

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1CompAvgPredTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1CompAvgPredTest_DISABLED_Speed_Test>
           *this)

{
  AV1CompAvgPredTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE>>
  ::parameter_ = &this->parameter_;
  this_00 = (AV1CompAvgPredTest *)operator_new(0x40);
  anon_unknown.dwarf_180f112::AV1CompAvgPredTest::AV1CompAvgPredTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f49860;
  (this_00->
  super_TestWithParam<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE>_>
  ).
  super_WithParamInterface<std::tuple<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AV1CompAvgPredTest_DISABLED_Speed_Test_00f498a0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }